

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void subtract_average_c(uint16_t *src,int16_t *dst,int width,int height,int round_offset,
                       int num_pel_log2)

{
  int i_1;
  int j_1;
  int avg;
  int i;
  int j;
  uint16_t *recon;
  int sum;
  int num_pel_log2_local;
  int round_offset_local;
  int height_local;
  int width_local;
  int16_t *dst_local;
  uint16_t *src_local;
  
  recon = src;
  sum = round_offset;
  for (j = 0; j < height; j = j + 1) {
    for (i = 0; i < width; i = i + 1) {
      sum = (uint)recon[i] + sum;
    }
    recon = recon + 0x20;
  }
  dst_local = dst;
  src_local = src;
  for (j_1 = 0; j_1 < height; j_1 = j_1 + 1) {
    for (i_1 = 0; i_1 < width; i_1 = i_1 + 1) {
      dst_local[i_1] = src_local[i_1] - (short)(sum >> ((byte)num_pel_log2 & 0x1f));
    }
    src_local = src_local + 0x20;
    dst_local = dst_local + 0x20;
  }
  return;
}

Assistant:

static void subtract_average_c(const uint16_t *src, int16_t *dst, int width,
                               int height, int round_offset, int num_pel_log2) {
  int sum = round_offset;
  const uint16_t *recon = src;
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      sum += recon[i];
    }
    recon += CFL_BUF_LINE;
  }
  const int avg = sum >> num_pel_log2;
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = src[i] - avg;
    }
    src += CFL_BUF_LINE;
    dst += CFL_BUF_LINE;
  }
}